

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHeap.hpp
# Opt level: O1

uint __thiscall
Lib::
BinaryHeap<FMB::FiniteModelBuilder::HackyDSAE::Constraint_Generator_*,_FMB::FiniteModelBuilder::HackyDSAE::Constraint_Generator_Compare>
::bubbleDown(BinaryHeap<FMB::FiniteModelBuilder::HackyDSAE::Constraint_Generator_*,_FMB::FiniteModelBuilder::HackyDSAE::Constraint_Generator_Compare>
             *this,uint index)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  Constraint_Generator **ppCVar5;
  Constraint_Generator *__tmp;
  Constraint_Generator *pCVar6;
  
  uVar4 = (ulong)index;
  uVar1 = this->_size;
  uVar3 = index * 2;
  do {
    if (uVar1 < uVar3) {
      return index;
    }
    if (uVar3 == uVar1) {
LAB_002a4a03:
      ppCVar5 = this->_data1;
      pCVar6 = ppCVar5[uVar4];
      if (pCVar6->_weight <= ppCVar5[uVar3]->_weight) {
        return (uint)uVar4;
      }
      ppCVar5[uVar4] = ppCVar5[uVar3];
LAB_002a4a1d:
      ppCVar5[uVar3] = pCVar6;
      index = uVar3;
    }
    else {
      ppCVar5 = this->_data1;
      pCVar6 = ppCVar5[uVar4];
      index = uVar3 | 1;
      uVar2 = ppCVar5[index]->_weight;
      if (pCVar6->_weight <= uVar2) goto LAB_002a4a03;
      if (ppCVar5[uVar3]->_weight < uVar2) {
        ppCVar5[uVar4] = ppCVar5[uVar3];
        goto LAB_002a4a1d;
      }
      ppCVar5[uVar4] = ppCVar5[index];
      ppCVar5[index] = pCVar6;
    }
    uVar4 = (ulong)index;
    uVar3 = index * 2;
  } while( true );
}

Assistant:

unsigned bubbleDown(unsigned index)
  {
    ASS(index>0 && index<=_size);
    unsigned nextIndex=index<<1;
    while(nextIndex<=_size) {
      if(nextIndex!=_size && Comparator::compare(_data1[index], _data1[nextIndex|1])==GREATER) {
	if(Comparator::compare(_data1[nextIndex|1], _data1[nextIndex])==GREATER) {
	  std::swap(_data1[index], _data1[nextIndex]);
	} else {
	  std::swap(_data1[index], _data1[nextIndex|1]);
	  nextIndex|=1;
	}
      } else if(Comparator::compare(_data1[index], _data1[nextIndex])==GREATER) {
	std::swap(_data1[index], _data1[nextIndex]);
      } else {
	return index;
      }
      index=nextIndex;
      nextIndex=index<<1;
    }
    return index;
  }